

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

char * uv__unknown_err_code(int err)

{
  size_t sVar1;
  char *__dest;
  char buf [32];
  char acStack_38 [40];
  
  snprintf(acStack_38,0x20,"Unknown system error %d",err);
  sVar1 = strlen(acStack_38);
  __dest = (char *)(*(code *)uv__allocator_0)(sVar1 + 1);
  if (__dest == (char *)0x0) {
    __dest = "Unknown system error";
  }
  else {
    memcpy(__dest,acStack_38,sVar1 + 1);
  }
  return __dest;
}

Assistant:

static const char* uv__unknown_err_code(int err) {
  char buf[32];
  char* copy;

  snprintf(buf, sizeof(buf), "Unknown system error %d", err);
  copy = uv__strdup(buf);

  return copy != NULL ? copy : "Unknown system error";
}